

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O3

ElementMatcherPairs *
testing::internal::FindMaxBipartiteMatching
          (ElementMatcherPairs *__return_storage_ptr__,MatchMatrix *g)

{
  MaxBipartiteMatchState MStack_48;
  
  MaxBipartiteMatchState::MaxBipartiteMatchState(&MStack_48,g);
  MaxBipartiteMatchState::Compute(__return_storage_ptr__,&MStack_48);
  if (MStack_48.right_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(MStack_48.right_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (MStack_48.left_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(MStack_48.left_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ElementMatcherPairs FindMaxBipartiteMatching(const MatchMatrix& g) {
  return MaxBipartiteMatchState(g).Compute();
}